

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aphy_impl.hpp
# Opt level: O0

ref<aphy::collision_mesh_collection>
aphy::
makeObjectWithInterface<aphy::collision_mesh_collection,APhyBullet::APhyBulletCollisionMeshCollection>
          (void)

{
  pointer theCounter;
  APhyBulletCollisionMeshCollection *in_RDI;
  unique_ptr<aphy::ref_counter<aphy::collision_mesh_collection>,_std::default_delete<aphy::ref_counter<aphy::collision_mesh_collection>_>_>
  counter;
  unique_ptr<APhyBullet::APhyBulletCollisionMeshCollection,_std::default_delete<APhyBullet::APhyBulletCollisionMeshCollection>_>
  object;
  pointer in_stack_ffffffffffffffa8;
  ref_counter<aphy::collision_mesh_collection> *in_stack_ffffffffffffffb0;
  unique_ptr<APhyBullet::APhyBulletCollisionMeshCollection,_std::default_delete<APhyBullet::APhyBulletCollisionMeshCollection>_>
  *this;
  APhyBulletCollisionMeshCollection *this_00;
  unique_ptr<APhyBullet::APhyBulletCollisionMeshCollection,_std::default_delete<APhyBullet::APhyBulletCollisionMeshCollection>_>
  local_28 [5];
  
  this_00 = in_RDI;
  ::operator_new(0x100);
  APhyBullet::APhyBulletCollisionMeshCollection::APhyBulletCollisionMeshCollection(this_00);
  std::
  unique_ptr<APhyBullet::APhyBulletCollisionMeshCollection,std::default_delete<APhyBullet::APhyBulletCollisionMeshCollection>>
  ::unique_ptr<std::default_delete<APhyBullet::APhyBulletCollisionMeshCollection>,void>
            ((unique_ptr<APhyBullet::APhyBulletCollisionMeshCollection,_std::default_delete<APhyBullet::APhyBulletCollisionMeshCollection>_>
              *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  ::operator_new(0x18);
  std::
  unique_ptr<APhyBullet::APhyBulletCollisionMeshCollection,_std::default_delete<APhyBullet::APhyBulletCollisionMeshCollection>_>
  ::release((unique_ptr<APhyBullet::APhyBulletCollisionMeshCollection,_std::default_delete<APhyBullet::APhyBulletCollisionMeshCollection>_>
             *)0x13071c);
  ref_counter<aphy::collision_mesh_collection>::ref_counter
            (in_stack_ffffffffffffffb0,&in_stack_ffffffffffffffa8->super_collision_mesh_collection);
  this = local_28;
  std::
  unique_ptr<aphy::ref_counter<aphy::collision_mesh_collection>,std::default_delete<aphy::ref_counter<aphy::collision_mesh_collection>>>
  ::unique_ptr<std::default_delete<aphy::ref_counter<aphy::collision_mesh_collection>>,void>
            ((unique_ptr<aphy::ref_counter<aphy::collision_mesh_collection>,_std::default_delete<aphy::ref_counter<aphy::collision_mesh_collection>_>_>
              *)this,(pointer)in_stack_ffffffffffffffa8);
  theCounter = std::
               unique_ptr<aphy::ref_counter<aphy::collision_mesh_collection>,_std::default_delete<aphy::ref_counter<aphy::collision_mesh_collection>_>_>
               ::release((unique_ptr<aphy::ref_counter<aphy::collision_mesh_collection>,_std::default_delete<aphy::ref_counter<aphy::collision_mesh_collection>_>_>
                          *)0x130749);
  ref<aphy::collision_mesh_collection>::ref
            ((ref<aphy::collision_mesh_collection> *)this_00,theCounter);
  std::
  unique_ptr<aphy::ref_counter<aphy::collision_mesh_collection>,_std::default_delete<aphy::ref_counter<aphy::collision_mesh_collection>_>_>
  ::~unique_ptr((unique_ptr<aphy::ref_counter<aphy::collision_mesh_collection>,_std::default_delete<aphy::ref_counter<aphy::collision_mesh_collection>_>_>
                 *)this);
  std::
  unique_ptr<APhyBullet::APhyBulletCollisionMeshCollection,_std::default_delete<APhyBullet::APhyBulletCollisionMeshCollection>_>
  ::~unique_ptr(this);
  return (ref<aphy::collision_mesh_collection>)(Counter *)in_RDI;
}

Assistant:

inline ref<I> makeObjectWithInterface(Args... args)
{
    std::unique_ptr<T> object(new T(args...));
    std::unique_ptr<ref_counter<I>> counter(new ref_counter<I> (object.release()));
    return ref<I> (counter.release());
}